

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

void __thiscall icu_63::RuleChain::RuleChain(RuleChain *this,RuleChain *other)

{
  UBool UVar1;
  OrConstraint *this_00;
  RuleChain *this_01;
  OrConstraint *that;
  RuleChain *local_90;
  OrConstraint *local_78;
  RuleChain *other_local;
  RuleChain *this_local;
  
  this->_vptr_RuleChain = (_func_int **)&PTR__RuleChain_004a0b18;
  UnicodeString::UnicodeString(&this->fKeyword,&other->fKeyword);
  this->fNext = (RuleChain *)0x0;
  this->ruleHeader = (OrConstraint *)0x0;
  UnicodeString::UnicodeString(&this->fDecimalSamples,&other->fDecimalSamples);
  that = (OrConstraint *)&other->fIntegerSamples;
  UnicodeString::UnicodeString(&this->fIntegerSamples,(UnicodeString *)that);
  this->fDecimalSamplesUnbounded = other->fDecimalSamplesUnbounded;
  this->fIntegerSamplesUnbounded = other->fIntegerSamplesUnbounded;
  this->fInternalStatus = other->fInternalStatus;
  UVar1 = ::U_FAILURE(this->fInternalStatus);
  if (UVar1 == '\0') {
    if (other->ruleHeader != (OrConstraint *)0x0) {
      this_00 = (OrConstraint *)UMemory::operator_new((UMemory *)0x20,(size_t)that);
      local_78 = (OrConstraint *)0x0;
      if (this_00 != (OrConstraint *)0x0) {
        that = other->ruleHeader;
        OrConstraint::OrConstraint(this_00,that);
        local_78 = this_00;
      }
      this->ruleHeader = local_78;
      if (this->ruleHeader == (OrConstraint *)0x0) {
        this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        UVar1 = ::U_FAILURE(this->ruleHeader->fInternalStatus);
        if (UVar1 != '\0') {
          this->fInternalStatus = this->ruleHeader->fInternalStatus;
          return;
        }
      }
    }
    if (other->fNext != (RuleChain *)0x0) {
      this_01 = (RuleChain *)UMemory::operator_new((UMemory *)0xe0,(size_t)that);
      local_90 = (RuleChain *)0x0;
      if (this_01 != (RuleChain *)0x0) {
        RuleChain(this_01,other->fNext);
        local_90 = this_01;
      }
      this->fNext = local_90;
      if (this->fNext == (RuleChain *)0x0) {
        this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        UVar1 = ::U_FAILURE(this->fNext->fInternalStatus);
        if (UVar1 != '\0') {
          this->fInternalStatus = this->fNext->fInternalStatus;
        }
      }
    }
  }
  return;
}

Assistant:

RuleChain::RuleChain(const RuleChain& other) :
        fKeyword(other.fKeyword), fDecimalSamples(other.fDecimalSamples),
        fIntegerSamples(other.fIntegerSamples), fDecimalSamplesUnbounded(other.fDecimalSamplesUnbounded),
        fIntegerSamplesUnbounded(other.fIntegerSamplesUnbounded), fInternalStatus(other.fInternalStatus) {
    if (U_FAILURE(this->fInternalStatus)) {
        return; // stop early if the object we are copying from is invalid. 
    }
    if (other.ruleHeader != nullptr) {
        this->ruleHeader = new OrConstraint(*(other.ruleHeader));
        if (this->ruleHeader == nullptr) {
            this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
        }
        else if (U_FAILURE(this->ruleHeader->fInternalStatus)) {
            // If the OrConstraint wasn't fully copied, then set our status to failure as well.
            this->fInternalStatus = this->ruleHeader->fInternalStatus;
            return; // exit early.
        }
    }
    if (other.fNext != nullptr ) {
        this->fNext = new RuleChain(*other.fNext);
        if (this->fNext == nullptr) {
            this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
        }
        else if (U_FAILURE(this->fNext->fInternalStatus)) {
            // If the RuleChain wasn't fully copied, then set our status to failure as well.
            this->fInternalStatus = this->fNext->fInternalStatus;
        }
    }
}